

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<char,_char,_char,_char,_char,_char,_char>,_testing::internal::CastAndAppendTransform<const_char_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>_>
::IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_3UL>::operator()
          (IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_3UL> *this,
          tuple<char,_char,_char,_char,_char,_char,_char> *param_2,
          IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_3UL> *param_3)

{
  __tuple_element_t<4UL,_tuple<char,_char,_char,_char,_char,_char,_char>_> *a;
  back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
  *this_00;
  back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
  bVar1;
  IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_2UL> local_5d [13];
  back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
  local_50;
  Matcher<const_char_&> local_48;
  tuple<char,_char,_char,_char,_char,_char,_char> *local_30;
  tuple<char,_char,_char,_char,_char,_char,_char> *t_local;
  IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_3UL> *this_local;
  back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
  out_local;
  
  local_30 = param_2;
  t_local = (tuple<char,_char,_char,_char,_char,_char,_char> *)this;
  this_local = param_3;
  a = std::get<4ul,char,char,char,char,char,char,char>(param_2);
  CastAndAppendTransform<char_const&>::operator()
            (&local_48,(CastAndAppendTransform<char_const&> *)((long)&out_local.container + 7),a);
  local_50 = std::
             back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
             ::operator++((back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
                           *)&this_local,0);
  this_00 = std::
            back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
            ::operator*(&local_50);
  std::
  back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
  ::operator=(this_00,&local_48);
  Matcher<const_char_&>::~Matcher(&local_48);
  bVar1 = IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_2UL>::operator()
                    (local_5d,local_30,this_local);
  return (back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator() (Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }